

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  size_t l;
  luaL_Buffer b;
  luaL_Buffer local_2048;
  
  sVar1 = strlen(p);
  local_2048.p = local_2048.buffer;
  local_2048.lvl = 0;
  local_2048.L = L;
  pcVar2 = strstr(s,p);
  if (pcVar2 != (char *)0x0) {
    do {
      luaL_addlstring(&local_2048,s,(long)pcVar2 - (long)s);
      l = strlen(r);
      luaL_addlstring(&local_2048,r,l);
      s = pcVar2 + sVar1;
      pcVar2 = strstr(s,p);
    } while (pcVar2 != (char *)0x0);
  }
  sVar1 = strlen(s);
  luaL_addlstring(&local_2048,s,sVar1);
  emptybuffer(&local_2048);
  lua_concat(local_2048.L,local_2048.lvl);
  local_2048.lvl = 1;
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar2;
}

Assistant:

LUALIB_API const char *luaL_gsub(lua_State *L, const char *s,
				 const char *p, const char *r)
{
  const char *wild;
  size_t l = strlen(p);
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while ((wild = strstr(s, p)) != NULL) {
    luaL_addlstring(&b, s, (size_t)(wild - s));  /* push prefix */
    luaL_addstring(&b, r);  /* push replacement in place of pattern */
    s = wild + l;  /* continue after `p' */
  }
  luaL_addstring(&b, s);  /* push last suffix */
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}